

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_spawn.cpp
# Opt level: O2

void test5(void)

{
  int (*paiVar1) [32];
  int j;
  long lVar2;
  int i;
  long lVar3;
  int local_2c;
  
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_2c = 0;
  depspawn::spawn<void(int,int),int,int&>(rec2,&local_2c,&nsize);
  t1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::wait_for_all();
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  paiVar1 = mx;
  for (lVar3 = 0; lVar3 < nsize; lVar3 = lVar3 + 1) {
    if (mx[lVar3][0] != 1) {
      doerror();
    }
    mx[lVar3][0] = 0;
    for (lVar2 = 1; lVar2 != 8; lVar2 = lVar2 + 1) {
      if ((*paiVar1)[lVar2] != 0) {
        doerror();
      }
    }
    paiVar1 = paiVar1 + 1;
  }
  pr("f(frozen int) rec2");
  return;
}

Assistant:

void test5() 
{
  
  t0 = std::chrono::high_resolution_clock::now();
  
  spawn(rec2, 0, nsize);
  
  t1 = std::chrono::high_resolution_clock::now();
  
  wait_for_all();
  
  t2 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    if(mx[i][0] != 1) doerror();
    mx[i][0] = 0;
    for (int j=1; j < 8; ++j)
      if(mx[i][j] != 0) doerror();
  }
  
  pr("f(frozen int) rec2");
  
}